

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O1

RealType __thiscall OpenMD::EAMAdapter::getF0(EAMAdapter *this)

{
  ZhouParameters zhouParam;
  ZhouParameters local_118;
  
  getZhouParam(&local_118,this);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_118.OF);
  if (local_118.OrhoE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.OrhoE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.OrhoE.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.OrhoE.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_118.OrhoLimits.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.OrhoLimits.super__Vector_base<double,_std::allocator<double>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_118.OrhoLimits.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.OrhoLimits.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_118.Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.Fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_118.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_118.F0;
}

Assistant:

RealType EAMAdapter::getF0() {
    ZhouParameters zhouParam = getZhouParam();
    return zhouParam.F0;
  }